

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int xmlDictGrow(xmlDictPtr dict,size_t size)

{
  uint uVar1;
  _xmlDictEntry *p_Var2;
  size_t sVar3;
  xmlChar *pxVar4;
  unsigned_long uVar5;
  _xmlDictEntry *p_Var6;
  int iVar7;
  _xmlDictEntry *p_Var8;
  unsigned_long uVar9;
  _xmlDictEntry *p_Var10;
  _xmlDictEntry *p_Var11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  int local_38;
  
  local_38 = -1;
  if ((7 < size) && (p_Var2 = dict->dict, p_Var2 != (_xmlDictEntry *)0x0)) {
    sVar3 = dict->size;
    p_Var8 = (_xmlDictEntry *)(*xmlMalloc)(size << 5);
    dict->dict = p_Var8;
    if (p_Var8 == (_xmlDictEntry *)0x0) {
      dict->dict = p_Var2;
    }
    else {
      local_38 = 0;
      memset(p_Var8,0,size << 5);
      dict->size = size;
      if (sVar3 != 0) {
        local_38 = 0;
        sVar15 = 0;
        do {
          if (p_Var2[sVar15].valid != 0) {
            p_Var8 = p_Var2 + sVar15;
            if (sVar3 == 0x80) {
              pxVar4 = p_Var8->name;
              uVar1 = p_Var8->len;
              if (dict->size == 0x80) {
                uVar9 = xmlDictComputeFastKey(pxVar4,uVar1,dict->seed);
              }
              else if (pxVar4 == (xmlChar *)0x0 || (int)uVar1 < 1) {
                uVar9 = 0;
              }
              else {
                uVar12 = dict->seed;
                uVar13 = 0;
                do {
                  uVar12 = (pxVar4[uVar13] + uVar12) * 0x401;
                  uVar12 = uVar12 >> 6 ^ uVar12;
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
                uVar9 = (unsigned_long)((uVar12 * 9 >> 0xb ^ uVar12 * 9) * 0x8001);
              }
            }
            else {
              uVar9 = p_Var8->okey;
            }
            uVar13 = uVar9 % dict->size;
            if (dict->dict[uVar13].valid == 0) {
              p_Var11 = dict->dict + uVar13;
              p_Var10 = p_Var8->next;
              pxVar4 = p_Var8->name;
              iVar7 = p_Var8->valid;
              uVar5 = p_Var8->okey;
              p_Var11->len = p_Var8->len;
              p_Var11->valid = iVar7;
              p_Var11->okey = uVar5;
              p_Var11->next = p_Var10;
              p_Var11->name = pxVar4;
              p_Var8 = dict->dict;
              p_Var8[uVar13].next = (_xmlDictEntry *)0x0;
              p_Var8[uVar13].okey = uVar9;
            }
            else {
              p_Var10 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
              if (p_Var10 == (_xmlDictEntry *)0x0) {
                local_38 = -1;
              }
              else {
                p_Var10->name = p_Var8->name;
                p_Var10->len = p_Var8->len;
                p_Var10->okey = uVar9;
                p_Var8 = dict->dict;
                p_Var10->next = p_Var8[uVar13].next;
                p_Var10->valid = 1;
                p_Var8[uVar13].next = p_Var10;
              }
            }
          }
          sVar15 = sVar15 + 1;
        } while (sVar15 != sVar3);
      }
      if (sVar3 != 0) {
        sVar15 = 0;
        do {
          p_Var8 = p_Var2[sVar15].next;
          while (p_Var8 != (_xmlDictEntry *)0x0) {
            p_Var10 = p_Var8->next;
            if (sVar3 == 0x80) {
              pxVar4 = p_Var8->name;
              uVar1 = p_Var8->len;
              if (dict->size == 0x80) {
                uVar13 = xmlDictComputeFastKey(pxVar4,uVar1,dict->seed);
              }
              else if (pxVar4 == (xmlChar *)0x0 || (int)uVar1 < 1) {
                uVar13 = 0;
              }
              else {
                uVar12 = dict->seed;
                uVar13 = 0;
                do {
                  uVar12 = (pxVar4[uVar13] + uVar12) * 0x401;
                  uVar12 = uVar12 >> 6 ^ uVar12;
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
                uVar13 = (ulong)((uVar12 * 9 >> 0xb ^ uVar12 * 9) * 0x8001);
              }
            }
            else {
              uVar13 = p_Var8->okey;
            }
            uVar14 = uVar13 % dict->size;
            p_Var11 = dict->dict + uVar14;
            if (dict->dict[uVar14].valid == 0) {
              p_Var6 = p_Var8->next;
              pxVar4 = p_Var8->name;
              iVar7 = p_Var8->valid;
              uVar9 = p_Var8->okey;
              p_Var11->len = p_Var8->len;
              p_Var11->valid = iVar7;
              p_Var11->okey = uVar9;
              p_Var11->next = p_Var6;
              p_Var11->name = pxVar4;
              p_Var11 = dict->dict;
              p_Var11[uVar14].next = (_xmlDictEntry *)0x0;
              p_Var11[uVar14].valid = 1;
              p_Var11[uVar14].okey = uVar13;
              (*xmlFree)(p_Var8);
              p_Var8 = p_Var10;
            }
            else {
              p_Var8->next = p_Var11->next;
              p_Var8->okey = uVar13;
              p_Var11->next = p_Var8;
              p_Var8 = p_Var10;
            }
          }
          sVar15 = sVar15 + 1;
        } while (sVar15 != sVar3);
      }
      (*xmlFree)(p_Var2);
    }
  }
  return local_38;
}

Assistant:

static int
xmlDictGrow(xmlDictPtr dict, size_t size) {
    unsigned long key, okey;
    size_t oldsize, i;
    xmlDictEntryPtr iter, next;
    struct _xmlDictEntry *olddict;
#ifdef DEBUG_GROW
    unsigned long nbElem = 0;
#endif
    int ret = 0;
    int keep_keys = 1;

    if (dict == NULL)
	return(-1);
    if (size < 8)
        return(-1);
    if (size > 8 * 2048)
	return(-1);

#ifdef DICT_DEBUG_PATTERNS
    fprintf(stderr, "*");
#endif

    oldsize = dict->size;
    olddict = dict->dict;
    if (olddict == NULL)
        return(-1);
    if (oldsize == MIN_DICT_SIZE)
        keep_keys = 0;

    dict->dict = xmlMalloc(size * sizeof(xmlDictEntry));
    if (dict->dict == NULL) {
	dict->dict = olddict;
	return(-1);
    }
    memset(dict->dict, 0, size * sizeof(xmlDictEntry));
    dict->size = size;

    /*	If the two loops are merged, there would be situations where
	a new entry needs to allocated and data copied into it from
	the main dict. It is nicer to run through the array twice, first
	copying all the elements in the main array (less probability of
	allocate) and then the rest, so we only free in the second loop.
    */
    for (i = 0; i < oldsize; i++) {
	if (olddict[i].valid == 0)
	    continue;

	if (keep_keys)
	    okey = olddict[i].okey;
	else
	    okey = xmlDictComputeKey(dict, olddict[i].name, olddict[i].len);
	key = okey % dict->size;

	if (dict->dict[key].valid == 0) {
	    memcpy(&(dict->dict[key]), &(olddict[i]), sizeof(xmlDictEntry));
	    dict->dict[key].next = NULL;
	    dict->dict[key].okey = okey;
	} else {
	    xmlDictEntryPtr entry;

	    entry = xmlMalloc(sizeof(xmlDictEntry));
	    if (entry != NULL) {
		entry->name = olddict[i].name;
		entry->len = olddict[i].len;
		entry->okey = okey;
		entry->next = dict->dict[key].next;
		entry->valid = 1;
		dict->dict[key].next = entry;
	    } else {
	        /*
		 * we don't have much ways to alert from here
		 * result is losing an entry and unicity guarantee
		 */
	        ret = -1;
	    }
	}
#ifdef DEBUG_GROW
	nbElem++;
#endif
    }

    for (i = 0; i < oldsize; i++) {
	iter = olddict[i].next;
	while (iter) {
	    next = iter->next;

	    /*
	     * put back the entry in the new dict
	     */

	    if (keep_keys)
		okey = iter->okey;
	    else
		okey = xmlDictComputeKey(dict, iter->name, iter->len);
	    key = okey % dict->size;
	    if (dict->dict[key].valid == 0) {
		memcpy(&(dict->dict[key]), iter, sizeof(xmlDictEntry));
		dict->dict[key].next = NULL;
		dict->dict[key].valid = 1;
		dict->dict[key].okey = okey;
		xmlFree(iter);
	    } else {
		iter->next = dict->dict[key].next;
		iter->okey = okey;
		dict->dict[key].next = iter;
	    }

#ifdef DEBUG_GROW
	    nbElem++;
#endif

	    iter = next;
	}
    }

    xmlFree(olddict);

#ifdef DEBUG_GROW
    xmlGenericError(xmlGenericErrorContext,
	    "xmlDictGrow : from %lu to %lu, %u elems\n", oldsize, size, nbElem);
#endif

    return(ret);
}